

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,_true,_true>::checkInvalidations
          (SimplifyLocals<false,_true,_true> *this,EffectAnalyzer *effects)

{
  bool bVar1;
  reference __in;
  type *__x;
  type *ptVar2;
  reference puVar3;
  uint local_8c;
  iterator iStack_88;
  uint index_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  type *info;
  type *index;
  _Self local_48;
  iterator __end0;
  iterator __begin0;
  Sinkables *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> invalidated;
  EffectAnalyzer *effects_local;
  SimplifyLocals<false,_true,_true> *this_local;
  
  invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)effects;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  __end0 = std::
           map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
           ::begin(&this->sinkables);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
       ::end(&this->sinkables);
  while (bVar1 = std::operator!=(&__end0,&local_48), bVar1) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>
           ::operator*(&__end0);
    __x = std::get<0ul,unsigned_int_const,wasm::SimplifyLocals<false,true,true>::SinkableInfo>(__in)
    ;
    ptVar2 = std::get<1ul,unsigned_int_const,wasm::SimplifyLocals<false,true,true>::SinkableInfo>
                       (__in);
    bVar1 = EffectAnalyzer::invalidates
                      ((EffectAnalyzer *)
                       invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,&ptVar2->effects);
    if (bVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,__x);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>
    ::operator++(&__end0);
  }
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  iStack_88 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_8c = *puVar3;
    std::
    map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
    ::erase(&this->sinkables,&local_8c);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  return;
}

Assistant:

void checkInvalidations(EffectAnalyzer& effects) {
    // TODO: this is O(bad)
    std::vector<Index> invalidated;
    for (auto& [index, info] : sinkables) {
      if (effects.invalidates(info.effects)) {
        invalidated.push_back(index);
      }
    }
    for (auto index : invalidated) {
      sinkables.erase(index);
    }
  }